

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.c
# Opt level: O3

void unload_game_resources(void)

{
  puts("unload_game_resources");
  FreePlayerAnimation(PlayerAnim);
  PlayerAnim = (Animation *)0x0;
  FreeState(LvlState);
  LvlState = BorrowState(Lvl);
  FreeLevel(Lvl);
  Lvl = (Level *)0x0;
  if (TanTable != (al_fixed *)0x0) {
    free(TanTable);
    TanTable = (al_fixed *)0x0;
  }
  return;
}

Assistant:

void unload_game_resources(void)
{
   printf("unload_game_resources\n");
   FreePlayerAnimation(PlayerAnim);
   PlayerAnim = NULL;

   FreeState(LvlState);
   LvlState = BorrowState(Lvl);
   FreeLevel(Lvl);
   Lvl = NULL;

   if (TanTable) {
      free(TanTable);
      TanTable = NULL;
   }
}